

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

void swapIntervalGLX(int interval)

{
  void *pvVar1;
  _GLFWwindow *window;
  int interval_local;
  
  pvVar1 = _glfwPlatformGetTls(&_glfw.contextSlot);
  if (_glfw.glx.EXT_swap_control == 0) {
    if (_glfw.glx.MESA_swap_control == 0) {
      if ((_glfw.glx.SGI_swap_control != 0) && (0 < interval)) {
        (*_glfw.glx.SwapIntervalSGI)(interval);
      }
    }
    else {
      (*_glfw.glx.SwapIntervalMESA)(interval);
    }
  }
  else {
    (*_glfw.glx.SwapIntervalEXT)(_glfw.x11.display,*(GLXDrawable *)((long)pvVar1 + 0x270),interval);
  }
  return;
}

Assistant:

static void swapIntervalGLX(int interval)
{
    _GLFWwindow* window = _glfwPlatformGetTls(&_glfw.contextSlot);

    if (_glfw.glx.EXT_swap_control)
    {
        _glfw.glx.SwapIntervalEXT(_glfw.x11.display,
                                  window->context.glx.window,
                                  interval);
    }
    else if (_glfw.glx.MESA_swap_control)
        _glfw.glx.SwapIntervalMESA(interval);
    else if (_glfw.glx.SGI_swap_control)
    {
        if (interval > 0)
            _glfw.glx.SwapIntervalSGI(interval);
    }
}